

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmSettings::Write(ON_3dmSettings *this,ON_BinaryArchive *file)

{
  int iVar1;
  undefined1 local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmSettings *this_local;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar1 == 1) {
    local_19 = Write_v1(this,file);
  }
  else {
    local_19 = Write_v2(this,file);
  }
  return local_19;
}

Assistant:

bool ON_3dmSettings::Write(ON_BinaryArchive& file) const
{
  bool rc = false;
  if ( 1 == file.Archive3dmVersion() ) 
  {
    rc = Write_v1(file); 
  }
  else
  {
    rc = Write_v2(file); 
  }
  return rc;
}